

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::value_task<std::tuple<std::__cxx11::string,int,int>>::
value_task<std::tuple<std::__cxx11::string,int,int>&>
          (value_task<std::tuple<std::__cxx11::string,int,int>> *this,bool has_name,string *name,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
          *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar4;
  node *__p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
  *(undefined1 (*) [16])(this + 8) = (undefined1  [16])0x0;
  *(undefined ***)this = &PTR__value_task_001ea960;
  __p = (node *)operator_new(0x80);
  __p->id_ = 0;
  __p->level_ = 0;
  __p->type_ = root;
  (__p->name_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->executor_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__p->parents_).
    super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__p->custom_data_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (__p->canceled_)._M_base._M_i = false;
  *(undefined4 *)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  *(undefined4 *)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  *(node **)(this + 0x18) = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<transwarp::node*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x20),__p);
  detail::
  make_future_with_value<std::tuple<std::__cxx11::string,int,int>,std::tuple<std::__cxx11::string,int,int>&>
            ((detail *)(this + 0x28),value);
  this[0x38] = (value_task<std::tuple<std::__cxx11::string,int,int>>)0x0;
  lVar2 = *(long *)(this + 0x18);
  *(undefined4 *)(lVar2 + 0x10) = 0;
  if (has_name) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    pcVar3 = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
      (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_38->field_2 + 8) = uVar4;
    }
    else {
      (local_38->_M_dataplus)._M_p = pcVar3;
      (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_38->_M_string_length = name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
              (&_Stack_30,local_38);
  }
  else {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x20);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar2 + 0x18) = local_38;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x20) = _Stack_30._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

value_task(bool has_name, std::string name, T&& value)
    : node_(new transwarp::node),
      future_(transwarp::detail::make_future_with_value<result_type>(std::forward<T>(value)))
    {
        transwarp::detail::node_manip::set_type(*node_, task_type::value);
        transwarp::detail::node_manip::set_name(*node_, (has_name ? std::shared_ptr<std::string>(new std::string(std::move(name))) : nullptr));
    }